

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-packed.c++
# Opt level: O3

size_t __thiscall
capnp::_::PackedInputStream::tryRead
          (PackedInputStream *this,ArrayPtr<unsigned_char> dstArray,size_t minBytes)

{
  ArrayPtr<const_unsigned_char> AVar1;
  ArrayPtr<const_unsigned_char> AVar2;
  PackedInputStream *pPVar3;
  int iVar4;
  undefined4 extraout_var;
  byte bVar5;
  uint uVar6;
  size_t maxBytes;
  size_t sVar8;
  size_t extraout_RDX;
  uint uVar7;
  size_t __n;
  uchar *__n_00;
  long lVar9;
  byte *pbVar10;
  uint uVar11;
  byte *pbVar12;
  byte *pbVar13;
  uchar *puVar14;
  byte bVar15;
  size_t sVar16;
  byte *pbVar17;
  long lVar18;
  uchar *__n_01;
  byte *pbVar19;
  bool bVar20;
  ArrayPtr<const_unsigned_char> AVar21;
  ArrayPtr<const_unsigned_char> AVar22;
  ArrayPtr<const_unsigned_char> AVar23;
  uint runLength;
  byte *local_90;
  PackedInputStream *local_88;
  DebugComparison<unsigned_long,_int> _kjCondition;
  Fault f;
  
  sVar8 = dstArray.size_;
  pbVar12 = dstArray.ptr;
  if (sVar8 == 0) {
    return 0;
  }
  iVar4 = (*(this->inner->super_InputStream)._vptr_InputStream[4])();
  AVar2.size_ = _kjCondition.left;
  AVar2.ptr = (uchar *)CONCAT44(extraout_var,iVar4);
  AVar23.size_ = extraout_RDX;
  AVar23.ptr = (uchar *)CONCAT44(extraout_var,iVar4);
  if (extraout_RDX == 0) {
    return 0;
  }
  pbVar17 = pbVar12 + sVar8;
  pbVar19 = pbVar12;
  local_90 = pbVar12;
  local_88 = this;
LAB_0019d31b:
  pPVar3 = local_88;
  _kjCondition.left = AVar2.size_;
  sVar16 = AVar23.size_;
  pbVar10 = AVar23.ptr;
  pbVar13 = AVar2.ptr + sVar16;
  if ((ulong)((long)pbVar13 - (long)pbVar10) < 10) {
    if (pbVar12 + minBytes <= pbVar19) {
      (*(local_88->inner->super_InputStream)._vptr_InputStream[3])
                (local_88->inner,(long)pbVar10 - (long)AVar2.ptr);
      return (size_t)(pbVar19 + -(long)local_90);
    }
    if (pbVar13 == pbVar10) {
      (*(local_88->inner->super_InputStream)._vptr_InputStream[3])();
      AVar23 = kj::BufferedInputStream::getReadBuffer(pPVar3->inner);
      _kjCondition.left = AVar23.size_;
      _kjCondition._8_8_ = _kjCondition._8_8_ & 0xffffffff00000000;
      _kjCondition.op.content.ptr = " > ";
      _kjCondition.op.content.size_ = 4;
      _kjCondition.result = _kjCondition.left != 0;
      AVar2 = AVar23;
      if (!_kjCondition.result) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&,char_const(&)[31]>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-packed.c++"
                   ,0x4f,FAILED,"buffer.size() > 0",
                   "_kjCondition,\"Premature end of packed input.\"",&_kjCondition,
                   (char (*) [31])"Premature end of packed input.");
        lVar9 = -(long)local_90;
LAB_0019d766:
        kj::_::Debug::Fault::~Fault(&f);
        return (size_t)(pbVar19 + lVar9);
      }
      goto LAB_0019d31b;
    }
    bVar15 = *pbVar10;
    pbVar10 = pbVar10 + 1;
    lVar9 = 0;
    lVar18 = 0;
    do {
      pPVar3 = local_88;
      _kjCondition.left = AVar2.size_;
      AVar21.size_ = sVar16;
      AVar21.ptr = pbVar10;
      if ((bVar15 >> ((uint)lVar9 & 0x1f) & 1) == 0) {
        bVar5 = 0;
      }
      else {
        if (AVar2.ptr + sVar16 == pbVar10) {
          (*(local_88->inner->super_InputStream)._vptr_InputStream[3])();
          AVar21 = kj::BufferedInputStream::getReadBuffer(pPVar3->inner);
          _kjCondition._8_8_ = _kjCondition._8_8_ & 0xffffffff00000000;
          _kjCondition.op.content.ptr = " > ";
          _kjCondition.op.content.size_ = 4;
          bVar20 = AVar21.size_ == 0;
          _kjCondition.result = !bVar20;
          AVar2 = AVar21;
          if (bVar20) {
            iVar4 = 0x5b;
            goto LAB_0019d750;
          }
        }
        sVar16 = AVar21.size_;
        bVar5 = *AVar21.ptr;
        pbVar10 = AVar21.ptr + 1;
      }
      pPVar3 = local_88;
      _kjCondition.left = AVar2.size_;
      AVar22.size_ = sVar16;
      AVar22.ptr = pbVar10;
      AVar1.size_ = sVar16;
      AVar1.ptr = pbVar10;
      pbVar19[lVar9] = bVar5;
      lVar18 = lVar18 + -1;
      lVar9 = lVar9 + 1;
    } while ((int)lVar9 != 8);
    pbVar13 = pbVar19 + -lVar18;
    if ((AVar2.ptr + sVar16 == pbVar10) && (AVar22 = AVar1, (byte)(bVar15 + 1) < 2)) {
      (*(local_88->inner->super_InputStream)._vptr_InputStream[3])();
      AVar22 = kj::BufferedInputStream::getReadBuffer(pPVar3->inner);
      _kjCondition._8_8_ = _kjCondition._8_8_ & 0xffffffff00000000;
      _kjCondition.op.content.ptr = " > ";
      _kjCondition.op.content.size_ = 4;
      _kjCondition.result = AVar22.size_ != 0;
      AVar2 = AVar22;
      if (_kjCondition.result) goto LAB_0019d540;
      iVar4 = 100;
LAB_0019d750:
      _kjCondition.left = 0;
      _kjCondition.op.content.size_ = 4;
      _kjCondition.op.content.ptr = " > ";
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&,char_const(&)[31]>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-packed.c++"
                 ,iVar4,FAILED,"buffer.size() > 0","_kjCondition,\"Premature end of packed input.\""
                 ,&_kjCondition,(char (*) [31])"Premature end of packed input.");
      lVar9 = -lVar18 - (long)local_90;
      goto LAB_0019d766;
    }
  }
  else {
    bVar15 = *pbVar10;
    bVar5 = pbVar10[1];
    if ((bVar15 & 1) == 0) {
      bVar5 = 0;
    }
    *pbVar19 = bVar5;
    lVar9 = (ulong)(bVar15 & 1) + 1;
    uVar6 = bVar15 >> 1 & 1;
    pbVar19[1] = -(char)uVar6 & pbVar10[(ulong)(bVar15 & 1) + 1];
    lVar18 = (ulong)uVar6 + lVar9;
    uVar11 = bVar15 >> 2 & 1;
    pbVar19[2] = -(char)uVar11 & pbVar10[(ulong)uVar6 + lVar9];
    lVar9 = (ulong)uVar11 + lVar18;
    uVar7 = bVar15 >> 3 & 1;
    pbVar19[3] = -(char)uVar7 & pbVar10[(ulong)uVar11 + lVar18];
    uVar6 = bVar15 >> 4 & 1;
    lVar18 = (ulong)uVar7 + lVar9;
    pbVar19[4] = -(char)uVar6 & pbVar10[(ulong)uVar7 + lVar9];
    lVar9 = (ulong)uVar6 + lVar18;
    uVar7 = bVar15 >> 5 & 1;
    pbVar19[5] = -(char)uVar7 & pbVar10[(ulong)uVar6 + lVar18];
    lVar18 = (ulong)uVar7 + lVar9;
    uVar6 = bVar15 >> 6 & 1;
    pbVar19[6] = -(char)uVar6 & pbVar10[(ulong)uVar7 + lVar9];
    pbVar19[7] = (char)bVar15 >> 7 & pbVar10[(ulong)uVar6 + lVar18];
    pbVar13 = pbVar19 + 8;
    AVar22.size_ = sVar16;
    AVar22.ptr = pbVar10 + (ulong)(bVar15 >> 7) + (ulong)uVar6 + lVar18;
  }
LAB_0019d540:
  _kjCondition.left = AVar2.size_;
  puVar14 = AVar2.ptr;
  sVar16 = AVar22.size_;
  pbVar10 = AVar22.ptr;
  if (bVar15 == 0xff) {
    __n_00 = (uchar *)((ulong)*pbVar10 * 8);
    runLength = (uint)__n_00;
    _kjCondition._8_8_ = (long)pbVar17 - (long)pbVar13;
    _kjCondition.left = (unsigned_long)&runLength;
    _kjCondition.op.content.ptr = " <= ";
    _kjCondition.op.content.size_ = 5;
    bVar20 = (long)(_kjCondition._8_8_ + (ulong)*pbVar10 * -8) < 0;
    _kjCondition.result = SBORROW8(_kjCondition._8_8_,(long)__n_00) == bVar20;
    if (SBORROW8(_kjCondition._8_8_,(long)__n_00) != bVar20) {
      iVar4 = 0x8d;
LAB_0019d815:
      _kjCondition.left = (unsigned_long)&runLength;
      _kjCondition.op.content.size_ = 5;
      _kjCondition.op.content.ptr = " <= ";
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,long>&,char_const(&)[56]>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-packed.c++"
                 ,iVar4,FAILED,"runLength <= outEnd - out",
                 "_kjCondition,\"Packed input did not end cleanly on a segment boundary.\"",
                 (DebugComparison<unsigned_int_&,_long> *)&_kjCondition,
                 (char (*) [56])"Packed input did not end cleanly on a segment boundary.");
      lVar9 = -(long)local_90;
      kj::_::Debug::Fault::~Fault(&f);
      return (size_t)(pbVar13 + lVar9);
    }
    pbVar10 = pbVar10 + 1;
    __n_01 = puVar14 + (sVar16 - (long)pbVar10);
    if (__n_01 < __n_00) {
      memcpy(pbVar13,pbVar10,(size_t)__n_01);
      pPVar3 = local_88;
      runLength = runLength - (int)__n_01;
      (*(local_88->inner->super_InputStream)._vptr_InputStream[3])(local_88->inner,sVar16);
      kj::InputStream::read
                (&pPVar3->inner->super_InputStream,(int)(pbVar13 + (long)__n_01),
                 (void *)(ulong)runLength,(size_t)(ulong)runLength);
      pbVar19 = pbVar13 + (long)__n_01 + runLength;
      if (pbVar19 == pbVar17) {
        return sVar8;
      }
      AVar23 = kj::BufferedInputStream::getReadBuffer(pPVar3->inner);
      AVar2.size_ = _kjCondition.left;
      AVar2.ptr = AVar23.ptr;
      goto LAB_0019d31b;
    }
    memcpy(pbVar13,pbVar10,(size_t)__n_00);
    pbVar13 = pbVar13 + runLength;
    pbVar10 = pbVar10 + runLength;
  }
  else if (bVar15 == 0) {
    __n = (ulong)*pbVar10 * 8;
    runLength = (uint)__n;
    _kjCondition._8_8_ = (long)pbVar17 - (long)pbVar13;
    _kjCondition.left = (unsigned_long)&runLength;
    _kjCondition.op.content.ptr = " <= ";
    _kjCondition.op.content.size_ = 5;
    bVar20 = (long)(_kjCondition._8_8_ + (ulong)*pbVar10 * -8) < 0;
    _kjCondition.result = SBORROW8(_kjCondition._8_8_,__n) == bVar20;
    if (SBORROW8(_kjCondition._8_8_,__n) != bVar20) {
      iVar4 = 0x81;
      goto LAB_0019d815;
    }
    pbVar10 = pbVar10 + 1;
    memset(pbVar13,0,__n);
    pbVar13 = pbVar13 + runLength;
  }
  AVar2.size_ = _kjCondition.left;
  AVar2.ptr = puVar14;
  AVar23.size_ = sVar16;
  AVar23.ptr = pbVar10;
  pbVar19 = pbVar13;
  if (pbVar13 == pbVar17) {
    (*(local_88->inner->super_InputStream)._vptr_InputStream[3])
              (local_88->inner,(long)pbVar10 - (long)puVar14);
    return sVar8;
  }
  goto LAB_0019d31b;
}

Assistant:

size_t PackedInputStream::tryRead(kj::ArrayPtr<byte> dstArray, size_t minBytes) {
  auto maxBytes = dstArray.size();
  uint8_t* const dst = dstArray.begin();
  if (maxBytes == 0) {
    return 0;
  }

  KJ_DREQUIRE(minBytes % sizeof(word) == 0, "PackedInputStream reads must be word-aligned.");
  KJ_DREQUIRE(maxBytes % sizeof(word) == 0, "PackedInputStream reads must be word-aligned.");

  uint8_t* __restrict__ out = dst;
  uint8_t* const outEnd = dst + maxBytes;
  uint8_t* const outMin = dst + minBytes;

  kj::ArrayPtr<const byte> buffer = inner.tryGetReadBuffer();
  if (buffer.size() == 0) {
    return 0;
  }
  const uint8_t* __restrict__ in = reinterpret_cast<const uint8_t*>(buffer.begin());

#define REFRESH_BUFFER() \
  inner.skip(buffer.size()); \
  buffer = inner.getReadBuffer(); \
  KJ_REQUIRE(buffer.size() > 0, "Premature end of packed input.") { \
    return out - dst; \
  } \
  in = reinterpret_cast<const uint8_t*>(buffer.begin())

#define BUFFER_END (reinterpret_cast<const uint8_t*>(buffer.end()))
#define BUFFER_REMAINING ((size_t)(BUFFER_END - in))

  for (;;) {
    uint8_t tag;

    KJ_DASSERT((out - dst) % sizeof(word) == 0,
           "Output pointer should always be aligned here.");

    if (BUFFER_REMAINING < 10) {
      if (out >= outMin) {
        // We read at least the minimum amount, so go ahead and return.
        inner.skip(in - reinterpret_cast<const uint8_t*>(buffer.begin()));
        return out - dst;
      }

      if (BUFFER_REMAINING == 0) {
        REFRESH_BUFFER();
        continue;
      }

      // We have at least 1, but not 10, bytes available.  We need to read slowly, doing a bounds
      // check on each byte.

      tag = *in++;

      for (uint i = 0; i < 8; i++) {
        if (tag & (1u << i)) {
          if (BUFFER_REMAINING == 0) {
            REFRESH_BUFFER();
          }
          *out++ = *in++;
        } else {
          *out++ = 0;
        }
      }

      if (BUFFER_REMAINING == 0 && (tag == 0 || tag == 0xffu)) {
        REFRESH_BUFFER();
      }
    } else {
      tag = *in++;

#define HANDLE_BYTE(n) \
      { \
         bool isNonzero = (tag & (1u << n)) != 0; \
         *out++ = *in & (-(int8_t)isNonzero); \
         in += isNonzero; \
      }

      HANDLE_BYTE(0);
      HANDLE_BYTE(1);
      HANDLE_BYTE(2);
      HANDLE_BYTE(3);
      HANDLE_BYTE(4);
      HANDLE_BYTE(5);
      HANDLE_BYTE(6);
      HANDLE_BYTE(7);
#undef HANDLE_BYTE
    }

    if (tag == 0) {
      KJ_DASSERT(BUFFER_REMAINING > 0, "Should always have non-empty buffer here.");

      uint runLength = *in++ * sizeof(word);

      KJ_REQUIRE(runLength <= outEnd - out,
                 "Packed input did not end cleanly on a segment boundary.") {
        return out - dst;
      }
      memset(out, 0, runLength);
      out += runLength;

    } else if (tag == 0xffu) {
      KJ_DASSERT(BUFFER_REMAINING > 0, "Should always have non-empty buffer here.");

      uint runLength = *in++ * sizeof(word);

      KJ_REQUIRE(runLength <= outEnd - out,
                 "Packed input did not end cleanly on a segment boundary.") {
        return out - dst;
      }

      size_t inRemaining = BUFFER_REMAINING;
      if (inRemaining >= runLength) {
        // Fast path.
        memcpy(out, in, runLength);
        out += runLength;
        in += runLength;
      } else {
        // Copy over the first buffer, then do one big read for the rest.
        memcpy(out, in, inRemaining);
        out += inRemaining;
        runLength -= inRemaining;

        inner.skip(buffer.size());
        inner.read(kj::arrayPtr(out, (size_t)runLength));
        out += runLength;

        if (out == outEnd) {
          return maxBytes;
        } else {
          buffer = inner.getReadBuffer();
          in = reinterpret_cast<const uint8_t*>(buffer.begin());

          // Skip the bounds check below since we just did the same check above.
          continue;
        }
      }
    }

    if (out == outEnd) {
      inner.skip(in - reinterpret_cast<const uint8_t*>(buffer.begin()));
      return maxBytes;
    }
  }

  KJ_FAIL_ASSERT("Can't get here.");
  return 0;  // GCC knows KJ_FAIL_ASSERT doesn't return, but Eclipse CDT still warns...

#undef REFRESH_BUFFER
}